

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionInliningCase::generateProgramData
          (ProgramData *__return_storage_ptr__,FunctionInliningCase *this,bool optimized)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  size_type *psVar4;
  long *plVar5;
  ulong *puVar6;
  int iVar7;
  ulong uVar8;
  string mainValueStatement;
  string precision;
  string maybeFuncDefs;
  string expression;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  int local_2dc;
  undefined4 *local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  undefined1 uStack_2c4;
  undefined1 uStack_2c3;
  undefined2 uStack_2c2;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  undefined8 local_290;
  long local_288;
  undefined8 uStack_280;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  ProgramData *local_1b8;
  FunctionInliningCase *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_2d8 = &local_2c8;
  if (CASESHADERTYPE_FRAGMENT < (this->super_ShaderOptimizationCase).m_caseShaderType) {
    uVar3 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,
                      CONCAT26(uStack_2c2,CONCAT15(uStack_2c3,CONCAT14(uStack_2c4,local_2c8))) + 1);
    }
    _Unwind_Resume(uVar3);
  }
  uStack_2c4 = 0x70;
  local_2c8 = 0x68676968;
  local_2d0 = 5;
  uStack_2c3 = 0;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"value*vec4(0.8, 0.7, 0.6, 0.9)","");
  if (optimized) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,0x1af8059);
    std::operator+(&local_340,"\tvalue = ",&local_258);
  }
  else {
    local_2dc = this->m_callNestingDepth;
    local_300 = &local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_2d8,local_2d0 + (long)local_2d8);
    std::__cxx11::string::append((char *)&local_300);
    puVar1 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2d8);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    psVar4 = puVar1 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_340.field_2._M_allocated_capacity = *psVar4;
      local_340.field_2._8_8_ = puVar1[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *psVar4;
      local_340._M_dataplus._M_p = (pointer)*puVar1;
    }
    local_340._M_string_length = puVar1[1];
    *puVar1 = psVar4;
    puVar1[1] = 0;
    *(undefined1 *)(puVar1 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_340);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_320.field_2._M_allocated_capacity = *psVar4;
      local_320.field_2._8_8_ = plVar2[3];
    }
    else {
      local_320.field_2._M_allocated_capacity = *psVar4;
      local_320._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_320._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_320,(ulong)local_258._M_dataplus._M_p);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_198 = *plVar5;
      lStack_190 = plVar2[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar5;
      local_1a8 = (long *)*plVar2;
    }
    local_1a0 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_278.field_2._M_allocated_capacity = *psVar4;
      local_278.field_2._8_8_ = plVar2[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar4;
      local_278._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_278._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_1b0 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_1b8 = __return_storage_ptr__;
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (1 < local_2dc) {
      iVar7 = 1;
      do {
        local_1f8 = local_1e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_2d8,local_2d0 + (long)local_2d8);
        std::__cxx11::string::append((char *)&local_1f8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar7);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar8 = 0xf;
        if (local_1f8 != local_1e8) {
          uVar8 = local_1e8[0];
        }
        if (uVar8 < (ulong)(local_210 + local_1f0)) {
          uVar8 = 0xf;
          if (local_218 != local_208) {
            uVar8 = local_208[0];
          }
          if (uVar8 < (ulong)(local_210 + local_1f0)) goto LAB_012d21d8;
          puVar1 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1f8);
        }
        else {
LAB_012d21d8:
          puVar1 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218);
        }
        local_298 = &local_288;
        plVar2 = puVar1 + 2;
        if ((long *)*puVar1 == plVar2) {
          local_288 = *plVar2;
          uStack_280 = puVar1[3];
        }
        else {
          local_288 = *plVar2;
          local_298 = (long *)*puVar1;
        }
        local_290 = puVar1[1];
        *puVar1 = plVar2;
        puVar1[1] = 0;
        *(undefined1 *)plVar2 = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_298);
        local_1d8 = &local_1c8;
        plVar5 = plVar2 + 2;
        if ((long *)*plVar2 == plVar5) {
          local_1c8 = *plVar5;
          lStack_1c0 = plVar2[3];
        }
        else {
          local_1c8 = *plVar5;
          local_1d8 = (long *)*plVar2;
        }
        local_1d0 = plVar2[1];
        *plVar2 = (long)plVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_2d8);
        local_2b8 = &local_2a8;
        plVar5 = plVar2 + 2;
        if ((long *)*plVar2 == plVar5) {
          local_2a8 = *plVar5;
          lStack_2a0 = plVar2[3];
        }
        else {
          local_2a8 = *plVar5;
          local_2b8 = (long *)*plVar2;
        }
        local_2b0 = plVar2[1];
        *plVar2 = (long)plVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_2b8);
        puVar6 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar6) {
          local_2f0 = *puVar6;
          lStack_2e8 = plVar2[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar6;
          local_300 = (ulong *)*plVar2;
        }
        local_2f8 = plVar2[1];
        *plVar2 = (long)puVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar7 + -1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar8 = 0xf;
        if (local_300 != &local_2f0) {
          uVar8 = local_2f0;
        }
        if (uVar8 < (ulong)(local_230 + local_2f8)) {
          uVar8 = 0xf;
          if (local_238 != local_228) {
            uVar8 = local_228[0];
          }
          if (uVar8 < (ulong)(local_230 + local_2f8)) goto LAB_012d2408;
          puVar1 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_012d2408:
          puVar1 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_238);
        }
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        psVar4 = puVar1 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_340.field_2._M_allocated_capacity = *psVar4;
          local_340.field_2._8_8_ = puVar1[3];
        }
        else {
          local_340.field_2._M_allocated_capacity = *psVar4;
          local_340._M_dataplus._M_p = (pointer)*puVar1;
        }
        local_340._M_string_length = puVar1[1];
        *puVar1 = psVar4;
        puVar1[1] = 0;
        *(undefined1 *)psVar4 = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        psVar4 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_320.field_2._M_allocated_capacity = *psVar4;
          local_320.field_2._8_8_ = plVar2[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar4;
          local_320._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_320._M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_320._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if (local_238 != local_228) {
          operator_delete(local_238,local_228[0] + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,local_2a8 + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if (local_298 != &local_288) {
          operator_delete(local_298,local_288 + 1);
        }
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != local_2dc);
    }
    this = local_1b0;
    iVar7 = local_1b0->m_callNestingDepth;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,iVar7 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x1be7a25);
    __return_storage_ptr__ = local_1b8;
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_2f0 = *puVar6;
      lStack_2e8 = plVar2[3];
      local_300 = &local_2f0;
    }
    else {
      local_2f0 = *puVar6;
      local_300 = (ulong *)*plVar2;
    }
    local_2f8 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_300);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_340.field_2._M_allocated_capacity = *psVar4;
      local_340.field_2._8_8_ = plVar2[3];
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    }
    else {
      local_340.field_2._M_allocated_capacity = *psVar4;
      local_340._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_340._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_340);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_320.field_2._M_allocated_capacity = *psVar4;
    local_320.field_2._8_8_ = plVar2[3];
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar4;
    local_320._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_320._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if (!optimized) {
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
  }
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     &local_278,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,
                    CONCAT26(uStack_2c2,CONCAT15(uStack_2c3,CONCAT14(uStack_2c4,local_2c8))) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string precision				= getShaderPrecision(m_caseShaderType);
		const string expression				= "value*vec4(0.8, 0.7, 0.6, 0.9)";
		const string maybeFuncDefs			= optimized ? "" : funcDefinitions(m_callNestingDepth, precision, expression);
		const string mainValueStatement		= (optimized ? "\tvalue = " + expression : "\tvalue = func" + toString(m_callNestingDepth-1) + "(value)") + ";\n";

		return defaultProgramData(m_caseShaderType, maybeFuncDefs, mainValueStatement);
	}